

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.hpp
# Opt level: O1

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)1>::draw_yamaha<(TI::TMS::ScreenMode)11>
          (Base<(TI::TMS::Personality)1> *this,uint8_t y,int start,int end)

{
  byte bVar1;
  iterator pvVar2;
  uint32_t *puVar3;
  int end_00;
  int start_00;
  uint uVar4;
  long lVar5;
  array<unsigned_int,_16UL> graphics7_sprite_palette;
  array<unsigned_int,_16UL> local_68;
  
  start_00 = start >> 2;
  end_00 = end >> 2;
  if (start_00 < end_00) {
    pvVar2 = this->draw_line_buffer_;
    puVar3 = this->pixel_target_;
    lVar5 = (long)start_00;
    do {
      bVar1 = (pvVar2->field_5).bitmap[lVar5];
      uVar4 = bVar1 & 0x1c;
      puVar3[lVar5] =
           ((uint)(bVar1 >> 6) + (uint)(bVar1 >> 5) * 4 | bVar1 & 0xffffffe0) << 8 |
           (bVar1 & 3) * 0x550000 | uVar4 >> 3 | uVar4 * 9;
      lVar5 = lVar5 + 1;
    } while (end_00 != lVar5);
  }
  local_68._M_elems[0xc] = 0xff;
  local_68._M_elems[0xd] = 0xff00ff;
  local_68._M_elems[0xe] = 0xffff;
  local_68._M_elems[0xf] = 0xffffff;
  local_68._M_elems[8] = 0x49ff92;
  local_68._M_elems[9] = 0xff0000;
  local_68._M_elems[10] = 0xff00;
  local_68._M_elems[0xb] = 0xffff00;
  local_68._M_elems[4] = 0x6d;
  local_68._M_elems[5] = 0x49006d;
  local_68._M_elems[6] = 0x6d6d;
  local_68._M_elems[7] = 0x496d6d;
  local_68._M_elems[0] = 0;
  local_68._M_elems[1] = 0x490000;
  local_68._M_elems[2] = 0x6d00;
  local_68._M_elems[3] = 0x496d00;
  draw_sprites<(TI::TMS::SpriteMode)1,false>(this,y,start_00,end_00,&local_68,(int *)0x0);
  return;
}

Assistant:

void Base<personality>::draw_yamaha(uint8_t y, int start, int end) {
	[[maybe_unused]] const auto active_palette = palette();
	const int sprite_start = start >> 2;
	const int sprite_end = end >> 2;
	auto &line_buffer = *draw_line_buffer_;

	// Observation justifying Duff's device below: it's acceptable to paint too many pixels — to paint
	// beyond `end` — provided that the overpainting is within normal bitmap bounds, because any
	// mispainted pixels will be replaced before becoming visible to the user.

	if constexpr (mode == ScreenMode::YamahaGraphics4 || mode == ScreenMode::YamahaGraphics6) {
		start >>= (mode == ScreenMode::YamahaGraphics4) ? 2 : 1;
		end >>= (mode == ScreenMode::YamahaGraphics4) ? 2 : 1;

		int column = start & ~1;
		const int offset = start & 1;
		start >>= 1;
		end = (end + 1) >> 1;

		switch(offset) {
			case 0:
				do {
						pixel_target_[column+0] = active_palette[line_buffer.bitmap[start] >> 4];	[[fallthrough]];
			case 1:		pixel_target_[column+1] = active_palette[line_buffer.bitmap[start] & 0xf];
						++start;
						column += 2;
				} while(start < end);
		}
	}

	if constexpr (mode == ScreenMode::YamahaGraphics5) {
		start >>= 1;
		end >>= 1;

		int column = start & ~3;
		const int offset = start & 3;
		start >>= 2;
		end = (end + 3) >> 2;

		switch(offset) {
			case 0:
				do {
					pixel_target_[column+0] = active_palette[line_buffer.bitmap[start] >> 6];			[[fallthrough]];
			case 1:	pixel_target_[column+1] = active_palette[(line_buffer.bitmap[start] >> 4) & 3];		[[fallthrough]];
			case 2:	pixel_target_[column+2] = active_palette[(line_buffer.bitmap[start] >> 2) & 3];		[[fallthrough]];
			case 3:	pixel_target_[column+3] = active_palette[line_buffer.bitmap[start] & 3];
					++start;
					column += 4;
				} while(start < end);
		}
	}

	if constexpr (mode == ScreenMode::YamahaGraphics7) {
		start >>= 2;
		end >>= 2;

		while(start < end) {
			pixel_target_[start] =
				palette_pack(
					uint8_t((line_buffer.bitmap[start] & 0x1c) + ((line_buffer.bitmap[start] & 0x1c) << 3) + ((line_buffer.bitmap[start] & 0x1c) >> 3)),
					uint8_t((line_buffer.bitmap[start] & 0xe0) + ((line_buffer.bitmap[start] & 0xe0) >> 3) + ((line_buffer.bitmap[start] & 0xe0) >> 6)),
					uint8_t((line_buffer.bitmap[start] & 0x03) + ((line_buffer.bitmap[start] & 0x03) << 2) + ((line_buffer.bitmap[start] & 0x03) << 4) + ((line_buffer.bitmap[start] & 0x03) << 6))
				);
			++start;
		}
	}

	constexpr std::array<uint32_t, 16> graphics7_sprite_palette = {
		palette_pack(0b00000000, 0b00000000, 0b00000000),	palette_pack(0b00000000, 0b00000000, 0b01001001),
		palette_pack(0b00000000, 0b01101101, 0b00000000),	palette_pack(0b00000000, 0b01101101, 0b01001001),
		palette_pack(0b01101101, 0b00000000, 0b00000000),	palette_pack(0b01101101, 0b00000000, 0b01001001),
		palette_pack(0b01101101, 0b01101101, 0b00000000),	palette_pack(0b01101101, 0b01101101, 0b01001001),

		palette_pack(0b10010010, 0b11111111, 0b01001001),	palette_pack(0b00000000, 0b00000000, 0b11111111),
		palette_pack(0b00000000, 0b11111111, 0b00000000),	palette_pack(0b00000000, 0b11111111, 0b11111111),
		palette_pack(0b11111111, 0b00000000, 0b00000000),	palette_pack(0b11111111, 0b00000000, 0b11111111),
		palette_pack(0b11111111, 0b11111111, 0b00000000),	palette_pack(0b11111111, 0b11111111, 0b11111111),
	};

	// Possibly TODO: is the data-sheet trying to allege some sort of colour mixing for sprites in Mode 6?
	draw_sprites<
		SpriteMode::Mode2,
		mode == ScreenMode::YamahaGraphics5 || mode == ScreenMode::YamahaGraphics6
	>(y, sprite_start, sprite_end, mode == ScreenMode::YamahaGraphics7 ? graphics7_sprite_palette : palette());
}